

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

cni_holder_base *
cs_impl::cni::construct_helper<cs_impl::any(cs_impl::member_visitor::*)()const>::
_construct<cs_impl::any(cs_impl::member_visitor::*&)()const,cs_impl::any,cs_impl::member_visitor_const&>
          (offset_in_member_visitor_to_subr *val,_func_any_member_visitor_ptr *target_function)

{
  cni_holder<cs_impl::any_(cs_impl::member_visitor::*)()_const,_cs_impl::any_(*)(const_cs_impl::member_visitor_&)>
  *this;
  
  this = (cni_holder<cs_impl::any_(cs_impl::member_visitor::*)()_const,_cs_impl::any_(*)(const_cs_impl::member_visitor_&)>
          *)operator_new(0x28);
  cni_holder<cs_impl::any_(cs_impl::member_visitor::*)()_const,_cs_impl::any_(*)(const_cs_impl::member_visitor_&)>
  ::cni_holder(this,val);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}